

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void * multi_thread_client_shutdown(void *args)

{
  uint uVar1;
  fdb_kvs_handle *pfVar2;
  btree *pbVar3;
  fdb_file_handle *pfVar4;
  fdb_custom_cmp_variable __th;
  size_t keylen;
  btree_kv_ops *key;
  fdb_doc *pfVar5;
  hbtrie *phVar6;
  bool bVar7;
  uint8_t *puVar8;
  fdb_status fVar9;
  int iVar10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig;
  size_t sVar11;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar12;
  size_t sVar13;
  size_t sVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar15;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *in_RCX;
  double *extraout_RDX;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *ptr_handle;
  ulong uVar16;
  fdb_kvs_config *pfVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar18;
  char cVar19;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar21;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar22;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar26;
  long lVar27;
  char *pcVar28;
  code *pcVar29;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *unaff_R12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 unaff_R15;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  uint8_t auStackY_12c1 [664];
  undefined1 auStackY_1029 [1152];
  undefined1 auStackY_ba9 [233];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_ab0 [20];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_a10 [17];
  undefined8 uStack_988;
  fdb_kvs_config afStack_970 [17];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 uStack_7a9;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_6e0 [10];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_690 [20];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_5f0 [32];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_4f0 [32];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_3f0 [32];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  timeval tStack_1f0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  kvs_ops_stat *pkStack_1c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_198;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_190;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_188;
  filemgr_ops *local_178;
  atomic<unsigned_long> aaStack_160 [2];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_150 [5];
  undefined1 local_121;
  undefined1 local_58 [8];
  timeval __test_begin;
  fdb_file_handle *tdbfile;
  
  pcVar29 = (code *)0x0;
  aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113bd7;
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  if (args == (void *)0x0) {
    aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113be5;
    memleak_start();
    aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113bf1;
    system("rm -rf  dummy* > errorlog.txt");
    local_150[0]._0_4_ = 0;
    do {
      pthread_create((pthread_t *)(local_150 + (long)(int)pcVar29 + -3),(pthread_attr_t *)0x0,
                     multi_thread_client_shutdown,local_150);
      pcVar29._4_4_ = 0;
      pcVar29._0_4_ = local_150[0]._0_4_ + 1;
      bVar7 = (int)local_150[0]._0_4_ < 1;
      local_150[0]._0_4_ = local_150[0]._0_4_ + 1;
    } while (bVar7);
    local_150[0]._0_4_ = 0;
    do {
      pthread_join((pthread_t)local_150[(long)(int)local_150[0]._0_4_ + -3],
                   &local_178 + (int)local_150[0]._0_4_);
      uVar32 = local_150[0]._0_4_;
      local_150[0]._0_4_ = local_150[0]._0_4_ + 1;
    } while ((int)uVar32 < 1);
    memleak_end();
    pcVar28 = "%s PASSED\n";
    if (multi_thread_client_shutdown(void*)::__test_pass != '\0') {
      pcVar28 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar28,"multi thread client shutdown");
    return (void *)0x0;
  }
  aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113cc6;
  fdb_get_default_config();
  aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113ccf;
  fdb_get_default_kvs_config();
  local_150[2] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x400;
  local_121 = 0;
  paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&__test_begin.tv_usec;
  aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113cee;
  fVar9 = fdb_open((fdb_file_handle **)&paVar12->seqtree,"./dummy1",(fdb_config *)local_150);
  if (fVar9 == FDB_RESULT_SUCCESS) {
    aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113cfb;
    fVar9 = fdb_close((fdb_file_handle *)__test_begin.tv_usec);
    if (fVar9 != FDB_RESULT_SUCCESS) {
      aaStack_160[0].super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)0x113d08;
      multi_thread_client_shutdown();
    }
    aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113d0d;
    fdb_shutdown();
    aaStack_160[0].super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x113d14;
    pthread_exit((void *)0x0);
  }
  aaStack_160[0].super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)multi_thread_kvs_client;
  multi_thread_client_shutdown();
  aVar20.seqtree = (btree *)aaStack_160;
  aVar21.seqtree = (btree *)aaStack_160;
  aVar22.seqtree = (btree *)aaStack_160;
  aVar23.seqtree = (btree *)aaStack_160;
  aVar24.seqtree = (btree *)aaStack_160;
  aVar25.seqtree = (btree *)aaStack_160;
  aVar26.seqtree = (btree *)aaStack_160;
  local_178 = (filemgr_ops *)0x0;
  pfVar17 = afStack_970;
  paVar18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)afStack_970;
  paStack_188 = local_150;
  aaStack_160[0].super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)&stack0xfffffffffffffff8;
  gettimeofday(&tStack_1f0,(__timezone_ptr_t)0x0);
  aStack_198.seqtree = (btree *)0x0;
  if (paVar12 != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
    fconfig.seqtree = (btree *)aaStack_5f0;
    fdb_get_default_config();
    unaff_R15.seqtree = (btree *)&aStack_7d8;
    memcpy(unaff_R15.seqtree,fconfig.seqtree,0xf8);
    handle.seqtree = (btree *)&aStack_190;
    fVar9 = fdb_open((fdb_file_handle **)handle.seqtree,"./dummy1",(fdb_config *)unaff_R15.seqtree);
    paVar31 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)afStack_970;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142ce;
    uVar1 = *(uint *)paVar12;
    paVar12 = aaStack_5f0;
    sprintf((char *)paVar12,"db%d",(ulong)uVar1);
    fconfig.seqtree = (btree *)&aStack_2f0;
    fdb_get_default_kvs_config();
    in_RCX = &aStack_1e0;
    uStack_1d0 = uStack_2e0;
    aStack_1e0 = aStack_2f0;
    uStack_1d8 = uStack_2e8;
    handle = aStack_190;
    fVar9 = fdb_kvs_open((fdb_file_handle *)aStack_190.seqtree,
                         (fdb_kvs_handle **)&aStack_1b8.seqtree,(char *)paVar12,
                         (fdb_kvs_config *)in_RCX);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142d3;
    paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    unaff_R15.seqtree = (btree *)0x0;
    do {
      sprintf((char *)&aStack_2f0,"key%d",(ulong)unaff_R15.seqtree & 0xffffffff);
      sprintf((char *)(aaStack_5f0 + 0x20),"meta%d",(ulong)unaff_R15.seqtree & 0xffffffff);
      sprintf((char *)(aaStack_5f0 + 0x40),"body%d",(ulong)unaff_R15.seqtree & 0xffffffff);
      pcVar29 = (code *)((long)paVar12 + (long)&afStack_970[0].create_if_missing);
      fconfig = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen((char *)&aStack_2f0);
      unaff_R12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                  strlen((char *)(aaStack_5f0 + 0x20));
      sVar11 = strlen((char *)(aaStack_5f0 + 0x40));
      in_RCX = aaStack_5f0 + 0x20;
      uStack_988 = 0x113e8c;
      fdb_doc_create((fdb_doc **)pcVar29,&aStack_2f0,(size_t)fconfig,in_RCX,(size_t)unaff_R12,
                     aaStack_5f0 + 0x40,sVar11);
      handle = aStack_1b8;
      fVar9 = fdb_set((fdb_kvs_handle *)aStack_1b8.seqtree,
                      *(fdb_doc **)(&afStack_970[0].create_if_missing + (long)unaff_R15.seqtree * 8)
                     );
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142b0;
      fdb_doc_free(*(fdb_doc **)(&afStack_970[0].create_if_missing + (long)unaff_R15.seqtree * 8));
      unaff_R15.seqtree = unaff_R15.seqtree + 1;
      paVar12 = paVar12 + 1;
    } while (unaff_R15.seqtree != (btree *)0x32);
    handle = aStack_190;
    fVar9 = fdb_commit((fdb_file_handle *)aStack_190.seqtree,'\x01');
    paVar18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)afStack_970;
    if (fVar9 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)aStack_190.seqtree);
      return (void *)0x0;
    }
    goto LAB_001142dd;
  }
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  paVar12 = aaStack_5f0;
  fdb_get_default_config();
  fconfig.seqtree = (btree *)&aStack_7d8;
  memcpy(fconfig.seqtree,paVar12,0xf8);
  uStack_7d0 = 0;
  uStack_7c8 = 0x400;
  uStack_7a9 = 0;
  handle.seqtree = (btree *)&aStack_190;
  fVar9 = fdb_open((fdb_file_handle **)handle.seqtree,"./dummy1",(fdb_config *)fconfig.seqtree);
  paVar18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)afStack_970;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142d8;
  aStack_1a0.seqtree = (btree *)(aaStack_ab0 + 0x14);
  paVar18 = aaStack_ab0;
  fconfig.seqtree = (btree *)aaStack_5f0;
  paVar12 = &aStack_1e0;
  unaff_R15.seqtree = (btree *)0x0;
  pcVar29 = (code *)0x0;
  do {
    sprintf((char *)fconfig.seqtree,"db%d",(ulong)pcVar29 & 0xffffffff);
    fdb_get_default_kvs_config();
    uStack_1d0 = uStack_2e0;
    aStack_1e0 = aStack_2f0;
    uStack_1d8 = uStack_2e8;
    in_RCX = paVar12;
    handle = aStack_190;
    fVar9 = fdb_kvs_open((fdb_file_handle *)aStack_190.seqtree,
                         (fdb_kvs_handle **)((long)(aaStack_6e0 + 10) + (long)unaff_R15.seqtree),
                         (char *)fconfig.seqtree,(fdb_kvs_config *)paVar12);
    unaff_R12 = paVar18;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142ba;
    handle = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aaStack_690[(long)pcVar29].seqtree;
    fVar9 = fdb_kvs_close((fdb_kvs_handle *)handle.seqtree);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142b5;
    pcVar29 = (code *)&((btree *)pcVar29)->vsize;
    unaff_R15.seqtree = unaff_R15.seqtree + 8;
  } while (pcVar29 != (code *)0x14);
  paVar12 = aaStack_6e0;
  lVar27 = 0;
  unaff_R15 = aStack_1a0;
  do {
    *(int *)paVar12 = (int)lVar27;
    in_RCX = paVar12;
    pthread_create((pthread_t *)unaff_R15.seqtree,(pthread_attr_t *)0x0,multi_thread_kvs_client,
                   paVar12);
    fconfig = aStack_1a0;
    lVar27 = lVar27 + 1;
    unaff_R15.seqtree = (btree *)&(unaff_R15.seqtree)->root_bid;
    paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)paVar12 + 4);
  } while (lVar27 != 0x14);
  lVar27 = 0;
  do {
    pthread_join(*(pthread_t *)((long)&(fconfig.seqtree)->ksize + lVar27),
                 (void **)((long)paVar18 + lVar27));
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0xa0);
  handle = aStack_190;
  fVar9 = fdb_commit((fdb_file_handle *)aStack_190.seqtree,'\0');
  pcVar29 = (code *)0x14;
  paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0xa0;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142e2;
  unaff_R12 = &aStack_2f0;
  fconfig.seqtree = (btree *)0x0;
  do {
    paVar12 = aaStack_5f0;
    sprintf((char *)paVar12,"db%d",(ulong)fconfig.seqtree & 0xffffffff);
    fdb_get_default_kvs_config();
    uStack_1d0 = uStack_1a8;
    aStack_1e0 = aStack_1b8;
    uStack_1d8 = uStack_1b0;
    unaff_R15.seqtree = (btree *)(aaStack_690 + fconfig.seqtree);
    in_RCX = &aStack_1e0;
    handle = aStack_190;
    fVar9 = fdb_kvs_open((fdb_file_handle *)aStack_190.seqtree,(fdb_kvs_handle **)unaff_R15.seqtree,
                         (char *)paVar12,(fdb_kvs_config *)in_RCX);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142bf;
    handle = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)
             *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)unaff_R15.seqtree;
    fVar9 = fdb_get_kvs_seqnum((fdb_kvs_handle *)handle.seqtree,(fdb_seqnum_t *)&pkStack_1c0);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142c4;
    aStack_1a0 = fconfig;
    if (pkStack_1c0 != (kvs_ops_stat *)0x32) {
      multi_thread_kvs_client();
    }
    pcVar29 = (code *)0x0;
    do {
      sprintf((char *)unaff_R12,"key%d",pcVar29);
      sprintf((char *)(aaStack_5f0 + 0x20),"meta%d",pcVar29);
      sprintf((char *)(aaStack_5f0 + 0x40),"body%d",pcVar29);
      sVar11 = strlen((char *)unaff_R12);
      in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      fdb_doc_create((fdb_doc **)&aStack_198.seqtree,unaff_R12,sVar11,(void *)0x0,0,(void *)0x0,0);
      handle = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)
               *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)unaff_R15.seqtree;
      fVar9 = fdb_get((fdb_kvs_handle *)handle.seqtree,(fdb_doc *)aStack_198.seqtree);
      aVar30 = aStack_198;
      if (fVar9 != FDB_RESULT_SUCCESS) {
        multi_thread_kvs_client();
        goto LAB_001142b0;
      }
      paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aStack_198.seqtrie)->aux;
      sVar11 = strlen((char *)unaff_R12);
      iVar10 = bcmp(paVar12,unaff_R12,sVar11);
      if (iVar10 != 0) {
        multi_thread_kvs_client();
        aVar30 = aStack_1b8;
      }
      iVar10 = bcmp((aVar30.seqtrie)->btree_leaf_kv_ops,aaStack_5f0 + 0x20,
                    (aVar30.seqtree)->root_bid);
      if (iVar10 != 0) {
        multi_thread_kvs_client();
        aVar30 = aStack_1b8;
      }
      iVar10 = bcmp((aVar30.seqtrie)->readkey,aaStack_5f0 + 0x40,
                    (size_t)(aVar30.seqtree)->blk_handle);
      fconfig = aVar30;
      if (iVar10 != 0) {
        multi_thread_kvs_client();
        fconfig = aStack_1b8;
      }
      fdb_doc_free((fdb_doc *)fconfig.seqtree);
      pcVar29._0_4_ = (int)pcVar29 + 1;
      pcVar29._4_4_ = 0;
    } while (pcVar29._0_4_ != 0x32);
    handle = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)
             *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)unaff_R15.seqtree;
    fVar9 = fdb_kvs_close((fdb_kvs_handle *)handle.seqtree);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001142c9;
    fconfig.seqtree = (btree *)&(aStack_1a0.seqtree)->vsize;
  } while (fconfig.seqtree != (btree *)0x14);
  fVar9 = fdb_close((fdb_file_handle *)aStack_190.seqtree);
  handle = aStack_190;
  if (fVar9 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    if (multi_thread_kvs_client(void*)::__test_pass == '\0') {
      pcVar28 = "%s PASSED\n";
    }
    else {
      pcVar28 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar28,"multi thread kvs client");
    return (void *)0x0;
  }
  goto LAB_001142e7;
LAB_001146d9:
  paVar18[-0x30].seqtree = (btree *)0x1146de;
  multi_thread_fhandle_share();
LAB_001146de:
  paVar18[-0x30].seqtree = (btree *)0x1146e3;
  multi_thread_fhandle_share();
LAB_001146e3:
  paVar18[-0x30].seqtree = (btree *)0x1146e8;
  multi_thread_fhandle_share();
LAB_001146e8:
  paVar12 = paVar18 + -0x2b;
  pcVar28 = "key%03d";
  paVar18[-0x30].seqtree = (btree *)0x1146ed;
  multi_thread_fhandle_share();
  goto LAB_001146ed;
LAB_00114e32:
  paVar18[-0x140].seqtree = (btree *)0x114e37;
  custom_compare_primitive_test();
LAB_00114e37:
  paVar18[-0x140].seqtree = (btree *)0x114e3c;
  custom_compare_primitive_test();
LAB_00114e3c:
  paVar18[-0x140].seqtree = (btree *)0x114e41;
  custom_compare_primitive_test();
  goto LAB_00114e41;
LAB_001142b0:
  paVar18[-1].seqtree = (btree *)0x1142b5;
  multi_thread_kvs_client();
LAB_001142b5:
  paVar18[-1].seqtree = (btree *)0x1142ba;
  multi_thread_kvs_client();
LAB_001142ba:
  paVar18[-1].seqtree = (btree *)0x1142bf;
  multi_thread_kvs_client();
LAB_001142bf:
  paVar18[-1].seqtree = (btree *)0x1142c4;
  multi_thread_kvs_client();
LAB_001142c4:
  paVar18[-1].seqtree = (btree *)0x1142c9;
  multi_thread_kvs_client();
LAB_001142c9:
  paVar18[-1].seqtree = (btree *)0x1142ce;
  multi_thread_kvs_client();
  paVar31 = paVar18;
LAB_001142ce:
  pfVar17 = (fdb_kvs_config *)paVar31;
  *(undefined8 *)((long)pfVar17 + -8) = 0x1142d3;
  multi_thread_kvs_client();
LAB_001142d3:
  *(undefined8 *)((long)pfVar17 + -8) = 0x1142d8;
  multi_thread_kvs_client();
  paVar18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pfVar17;
LAB_001142d8:
  *(undefined8 *)((long)paVar18 + -8) = 0x1142dd;
  multi_thread_kvs_client();
LAB_001142dd:
  *(undefined8 *)((long)paVar18 + -8) = 0x1142e2;
  multi_thread_kvs_client();
LAB_001142e2:
  paVar18[-1].seqtree = (btree *)0x1142e7;
  multi_thread_kvs_client();
LAB_001142e7:
  paVar18[-1].seqtree = (btree *)multi_thread_fhandle_share;
  multi_thread_kvs_client();
  paVar18[-1].seqtree = (btree *)aaStack_160;
  paVar18[-2].seqtree = (btree *)unaff_R15;
  paVar18[-3] = fconfig;
  paVar18[-4].seqtree = (btree *)pcVar29;
  paVar18[-5] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)unaff_R12;
  paVar18[-6].seqtree = (btree *)paVar12;
  paVar18[-0x30].seqtree = (btree *)0x11430c;
  gettimeofday((timeval *)(paVar18 + -0x27),(__timezone_ptr_t)0x0);
  if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)handle.seqtree !=
      (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
    if (*(char *)&(handle.seqtree)->kv_ops == '\0') {
      if (((ulong)(handle.seqtree)->kv_ops & 0x100) == 0) {
        paVar12 = paVar18 + -0x2b;
        unaff_R12 = paVar18 + -0x25;
        pcVar29 = (code *)(paVar18 + -0x2e);
        aVar20.seqtree = (btree *)0x0;
        do {
          paVar18[-0x25].seqtree = (btree *)0x0;
          paVar18[-0x30].seqtree = (btree *)0x1143fa;
          sprintf((char *)paVar12,"key%03d",aVar20.seqtree);
          pfVar2 = (fdb_kvs_handle *)(handle.seqtree)->blk_handle;
          paVar18[-0x30].seqtree = (btree *)0x114411;
          in_RCX = unaff_R12;
          fVar9 = fdb_get_kv(pfVar2,paVar12,7,&unaff_R12->seqtree,(size_t *)pcVar29);
          if (fVar9 == FDB_RESULT_HANDLE_BUSY) {
            paVar18[-0x30].seqtree = (btree *)0x1146cf;
            multi_thread_fhandle_share();
LAB_001146cf:
            paVar18[-0x30].seqtree = (btree *)0x1146d4;
            multi_thread_fhandle_share();
LAB_001146d4:
            paVar18[-0x30].seqtree = (btree *)0x1146d9;
            multi_thread_fhandle_share();
            goto LAB_001146d9;
          }
          pfVar2 = (fdb_kvs_handle *)(handle.seqtree)->blk_ops;
          paVar18[-0x30].seqtree = (btree *)0x114431;
          in_RCX = unaff_R12;
          fVar9 = fdb_get_kv(pfVar2,paVar12,7,&unaff_R12->seqtree,(size_t *)pcVar29);
          if (fVar9 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146cf;
          pfVar2 = (fdb_kvs_handle *)(handle.seqtree)->root_bid;
          paVar18[-0x30].seqtree = (btree *)0x114451;
          in_RCX = unaff_R12;
          fVar9 = fdb_get_kv(pfVar2,paVar12,7,&unaff_R12->seqtree,(size_t *)pcVar29);
          if (fVar9 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146d4;
          aVar20._0_4_ = aVar20._0_4_ + 1;
          aVar20._4_4_ = 0;
        } while ((aVar20._0_4_ != 2000) ||
                (aVar20.seqtree = (btree *)0x0, ((ulong)(handle.seqtree)->kv_ops & 0x100) == 0));
      }
    }
    else {
      paVar12 = paVar18 + -0x2b;
      aVar20.seqtree = (btree *)0x0;
      do {
        paVar18[-0x30].seqtree = (btree *)0x11433c;
        sprintf((char *)paVar12,"key%03d",aVar20.seqtree);
        pfVar2 = (fdb_kvs_handle *)(handle.seqtree)->blk_handle;
        in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
        paVar18[-0x30].seqtree = (btree *)0x114352;
        fVar9 = fdb_set_kv(pfVar2,paVar12,7,(void *)0x0,0);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001146e8;
        pfVar2 = (fdb_kvs_handle *)(handle.seqtree)->blk_ops;
        in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
        paVar18[-0x30].seqtree = (btree *)0x114370;
        fVar9 = fdb_set_kv(pfVar2,paVar12,7,(void *)0x0,0);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001146e3;
        pfVar2 = (fdb_kvs_handle *)(handle.seqtree)->root_bid;
        in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
        paVar18[-0x30].seqtree = (btree *)0x11438e;
        fVar9 = fdb_set_kv(pfVar2,paVar12,7,(void *)0x0,0);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001146de;
        pbVar3 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle.seqtree)->ksize)->
                 seqtree;
        paVar18[-0x30].seqtree = (btree *)0x1143a3;
        fVar9 = fdb_commit((fdb_file_handle *)pbVar3,'\x01');
        if (fVar9 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146d9;
        aVar20._0_4_ = aVar20._0_4_ + 1;
        aVar20._4_4_ = 0;
      } while (aVar20._0_4_ != 2000);
    }
    return (void *)0x0;
  }
  paVar18[-0x30].seqtree = (btree *)0x114487;
  handle.seqtree = (btree *)malloc(0x10);
  paVar18[-0x30].seqtree = (btree *)0x114494;
  pcVar28 = (char *)malloc(0x50);
  paVar18[-0x30].seqtree = (btree *)0x1144a1;
  paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)malloc(0x10);
  paVar18[-0x30].seqtree = (btree *)0x1144b0;
  system("rm -rf  func_test* > errorlog.txt");
  unaff_R12 = paVar18 + -0x25;
  paVar18[-0x30].seqtree = (btree *)0x1144bd;
  fdb_get_default_config();
  paVar18[-0x24].seqtree = (btree *)0x0;
  *(undefined1 *)((long)paVar18 + -0xf9) = 0;
  paVar18[-0x16] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  paVar18[-0x30].seqtree = (btree *)0x1144df;
  fdb_get_default_kvs_config();
  pcVar29 = (code *)(paVar18 + -0x2b);
  paVar18[-0x30].seqtree = (btree *)0x1144f7;
  sprintf((char *)pcVar29,"./func_test_pt.%d",0);
  paVar18[-0x30].seqtree = (btree *)0x114505;
  fVar9 = fdb_open((fdb_file_handle **)&paVar18[-0x2f].seqtree,(char *)pcVar29,
                   (fdb_config *)unaff_R12);
  if (fVar9 == FDB_RESULT_SUCCESS) {
    pfVar4 = (fdb_file_handle *)paVar18[-0x2f].seqtree;
    *(fdb_file_handle **)pcVar28 = pfVar4;
    *(fdb_file_handle **)(pcVar28 + 0x28) = pfVar4;
    pcVar28[0x20] = '\x01';
    pcVar28[0x48] = '\0';
    paVar18[-0x30].seqtree = (btree *)0x114530;
    fVar9 = fdb_kvs_open_default
                      (pfVar4,(fdb_kvs_handle **)(pcVar28 + 0x30),
                       (fdb_kvs_config *)(paVar18 + -0x2e));
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001146f2;
    in_RCX = paVar18 + -0x2e;
    paVar18[-0x30].seqtree = (btree *)0x114551;
    fVar9 = fdb_kvs_open((fdb_file_handle *)paVar18[-0x2f].seqtree,
                         (fdb_kvs_handle **)(pcVar28 + 0x38),"main",(fdb_kvs_config *)in_RCX);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001146f7;
    in_RCX = paVar18 + -0x2e;
    paVar18[-0x30].seqtree = (btree *)0x114572;
    fVar9 = fdb_kvs_open((fdb_file_handle *)paVar18[-0x2f].seqtree,
                         (fdb_kvs_handle **)(pcVar28 + 0x40),"back",(fdb_kvs_config *)in_RCX);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001146fc;
    paVar18[-0x30].seqtree = (btree *)0x11458c;
    fVar9 = fdb_kvs_open_default
                      ((fdb_file_handle *)paVar18[-0x2f].seqtree,(fdb_kvs_handle **)(pcVar28 + 8),
                       (fdb_kvs_config *)(paVar18 + -0x2e));
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00114701;
    in_RCX = paVar18 + -0x2e;
    paVar18[-0x30].seqtree = (btree *)0x1145ad;
    fVar9 = fdb_kvs_open((fdb_file_handle *)paVar18[-0x2f].seqtree,
                         (fdb_kvs_handle **)(pcVar28 + 0x10),"main",(fdb_kvs_config *)in_RCX);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00114706;
    in_RCX = paVar18 + -0x2e;
    paVar18[-0x30].seqtree = (btree *)0x1145ce;
    fVar9 = fdb_kvs_open((fdb_file_handle *)paVar18[-0x2f].seqtree,
                         (fdb_kvs_handle **)(pcVar28 + 0x18),"back",(fdb_kvs_config *)in_RCX);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011470b;
    paVar18[-0x30].seqtree = (btree *)0x1145ee;
    printf("Creating %d writers+readers over %d docs..\n",1,2000);
    unaff_R12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(pcVar28 + 0x28);
    lVar27 = 8;
    pcVar29 = multi_thread_fhandle_share;
    do {
      LOCK();
      *(undefined1 *)((long)unaff_R12 + 0x21) = 0;
      UNLOCK();
      paVar18[-0x30].seqtree = (btree *)0x114619;
      in_RCX = unaff_R12;
      pthread_create((pthread_t *)((long)&(handle.seqtree)->ksize + lVar27),(pthread_attr_t *)0x0,
                     multi_thread_fhandle_share,unaff_R12);
      lVar27 = lVar27 + -8;
      unaff_R12 = unaff_R12 + -5;
    } while (lVar27 != -8);
    aVar26 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle.seqtree)->ksize;
    paVar18[-0x30].seqtree = (btree *)0x114632;
    pthread_join((pthread_t)aVar26,&paVar12->seqtree);
    paVar18[-0x30].seqtree = (btree *)0x114642;
    printf("Writer %d done\n",0);
    LOCK();
    pcVar28[0x49] = '\x01';
    UNLOCK();
    __th = (fdb_custom_cmp_variable)(handle.seqtree)->root_bid;
    paVar18[-0x30].seqtree = (btree *)0x114658;
    pthread_join((pthread_t)__th,&paVar12[1].seqtree);
    pfVar4 = *(fdb_file_handle **)pcVar28;
    paVar18[-0x30].seqtree = (btree *)0x114660;
    fVar9 = fdb_close(pfVar4);
    aVar26 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0xfffffffffffffff8;
    if (fVar9 == FDB_RESULT_SUCCESS) {
      paVar18[-0x30].seqtree = (btree *)0x114670;
      free(handle.seqtree);
      paVar18[-0x30].seqtree = (btree *)0x114678;
      free(pcVar28);
      paVar18[-0x30].seqtree = (btree *)0x114680;
      free(paVar12);
      paVar18[-0x30].seqtree = (btree *)0x114685;
      fdb_shutdown();
      pcVar28 = "%s PASSED\n";
      if (multi_thread_fhandle_share(void*)::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      paVar18[-0x30].seqtree = (btree *)0x1146b6;
      fprintf(_stderr,pcVar28,"multi thread file handle share test");
      return (void *)0x0;
    }
  }
  else {
LAB_001146ed:
    paVar18[-0x30].seqtree = (btree *)0x1146f2;
    multi_thread_fhandle_share();
    aVar21 = aVar20;
LAB_001146f2:
    paVar18[-0x30].seqtree = (btree *)0x1146f7;
    multi_thread_fhandle_share();
    aVar22 = aVar21;
LAB_001146f7:
    paVar18[-0x30].seqtree = (btree *)0x1146fc;
    multi_thread_fhandle_share();
    aVar23 = aVar22;
LAB_001146fc:
    paVar18[-0x30].seqtree = (btree *)0x114701;
    multi_thread_fhandle_share();
    aVar24 = aVar23;
LAB_00114701:
    paVar18[-0x30].seqtree = (btree *)0x114706;
    multi_thread_fhandle_share();
    aVar25 = aVar24;
LAB_00114706:
    paVar18[-0x30].seqtree = (btree *)0x11470b;
    multi_thread_fhandle_share();
    aVar26 = aVar25;
LAB_0011470b:
    paVar18[-0x30].seqtree = (btree *)0x114710;
    multi_thread_fhandle_share();
  }
  paVar18[-0x30].seqtree = (btree *)incomplete_block_test;
  multi_thread_fhandle_share();
  paVar18[-0x30] = aVar26;
  paVar18[-0x31] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)paVar12;
  paVar18[-0x32] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar28;
  paVar18[-0x33] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar29;
  paVar18[-0x34] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)unaff_R12;
  paVar18[-0x35] = handle;
  paVar18[-0xc3].seqtree = (btree *)0x114735;
  gettimeofday((timeval *)(paVar18 + -0xba),(__timezone_ptr_t)0x0);
  paVar18[-0xc3].seqtree = (btree *)0x11473a;
  memleak_start();
  paVar18[-0xc0].seqtree = (btree *)0x0;
  paVar18[-0xc3].seqtree = (btree *)0x11474b;
  system("rm -rf  dummy* > errorlog.txt");
  paVar18[-0xc3].seqtree = (btree *)0x114758;
  fdb_get_default_config();
  paVar12 = paVar18 + -0xb8;
  paVar18[-0xc3].seqtree = (btree *)0x114765;
  fdb_get_default_kvs_config();
  paVar18[-0xb4].seqtree = (btree *)0x0;
  paVar18[-0xb3] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x400;
  *(undefined4 *)((long)paVar18 + -0x584) = 1;
  *(undefined1 *)((long)paVar18 + -0x579) = 0;
  paVar31 = paVar18 + -0xbb;
  paVar18[-0xc3].seqtree = (btree *)0x114793;
  fdb_open((fdb_file_handle **)&paVar31->seqtree,"./dummy1",(fdb_config *)(paVar18 + -0xb5));
  ptr_handle = paVar18 + -0xbf;
  paVar18[-0xc3].seqtree = (btree *)0x1147a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)paVar31->seqtree,(fdb_kvs_handle **)&ptr_handle->seqtree,
             (fdb_kvs_config *)paVar12);
  paVar18[-0xc3].seqtree = (btree *)0x1147bc;
  fVar9 = fdb_set_log_callback
                    ((fdb_kvs_handle *)ptr_handle->seqtree,logCallbackFunc,"incomplete_block_test");
  if (fVar9 == FDB_RESULT_SUCCESS) {
    ptr_handle = paVar18 + -0x56;
    paVar18[-0xc3].seqtree = (btree *)0x1147df;
    sprintf((char *)ptr_handle,"key%d",0);
    unaff_R12 = paVar18 + -0x76;
    paVar18[-0xc3].seqtree = (btree *)0x1147fa;
    sprintf((char *)unaff_R12,"meta%d",0);
    pcVar29 = (code *)(paVar18 + -0x96);
    paVar18[-0xc3].seqtree = (btree *)0x114815;
    sprintf((char *)pcVar29,"body%d",0);
    paVar18[-0xc3].seqtree = (btree *)0x11481d;
    sVar11 = strlen((char *)ptr_handle);
    paVar18[-0xc3].seqtree = (btree *)0x114828;
    sVar13 = strlen((char *)unaff_R12);
    paVar18[-0xc3].seqtree = (btree *)0x114833;
    sVar14 = strlen((char *)pcVar29);
    paVar18[-0xc2] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)sVar14;
    paVar12 = paVar18 + -0xbe;
    paVar18[-0xc3].seqtree = (btree *)0x114853;
    fdb_doc_create((fdb_doc **)&paVar12->seqtree,ptr_handle,sVar11,unaff_R12,sVar13,pcVar29,
                   *(size_t *)(paVar18 + -0xc2));
    paVar18[-0xc3].seqtree = (btree *)0x114860;
    fdb_set((fdb_kvs_handle *)paVar18[-0xbf].seqtree,(fdb_doc *)paVar12->seqtree);
    paVar18[-0xc3].seqtree = (btree *)0x114876;
    sprintf((char *)ptr_handle,"key%d",1);
    paVar18[-0xc3].seqtree = (btree *)0x11488c;
    sprintf((char *)unaff_R12,"meta%d",1);
    paVar18[-0xc3].seqtree = (btree *)0x1148a2;
    sprintf((char *)pcVar29,"body%d",1);
    paVar18[-0xc3].seqtree = (btree *)0x1148aa;
    sVar11 = strlen((char *)ptr_handle);
    paVar18[-0xc3].seqtree = (btree *)0x1148b5;
    sVar13 = strlen((char *)unaff_R12);
    paVar18[-0xc3].seqtree = (btree *)0x1148c0;
    sVar14 = strlen((char *)pcVar29);
    paVar18[-0xc2] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)sVar14;
    paVar18[-0xc3].seqtree = (btree *)0x1148dd;
    fdb_doc_create((fdb_doc **)&paVar18[-0xbd].seqtree,ptr_handle,sVar11,unaff_R12,sVar13,pcVar29,
                   *(size_t *)(paVar18 + -0xc2));
    paVar18[-0xc3].seqtree = (btree *)0x1148eb;
    fdb_set((fdb_kvs_handle *)paVar18[-0xbf].seqtree,(fdb_doc *)paVar18[-0xbd].seqtree);
    aVar26._1_7_ = (undefined7)(sVar13 >> 8);
    aVar26._0_1_ = 1;
    paVar31 = paVar18 + -0xc0;
    while( true ) {
      pbVar3 = paVar12->seqtree;
      keylen._0_1_ = pbVar3->ksize;
      keylen._1_1_ = pbVar3->vsize;
      keylen._2_2_ = pbVar3->height;
      keylen._4_4_ = pbVar3->blksize;
      key = pbVar3->kv_ops;
      paVar18[-0xc2].seqtree = (btree *)0x0;
      in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      paVar18[-0xc3].seqtree = (btree *)0x114915;
      fdb_doc_create((fdb_doc **)&paVar31->seqtree,key,keylen,(void *)0x0,0,(void *)0x0,
                     *(size_t *)(paVar18 + -0xc2));
      paVar18[-0xc3].seqtree = (btree *)0x114924;
      fVar9 = fdb_get((fdb_kvs_handle *)paVar18[-0xbf].seqtree,(fdb_doc *)paVar18[-0xc0].seqtree);
      if (fVar9 != FDB_RESULT_SUCCESS) break;
      unaff_R12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)paVar18[-0xc0].seqtree;
      aVar21 = unaff_R12[1];
      pcVar29 = (code *)unaff_R12[7].seqtree;
      ptr_handle = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)paVar12->seqtree;
      paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)ptr_handle[7].seqtree;
      paVar18[-0xc3].seqtree = (btree *)0x11494d;
      iVar10 = bcmp(pcVar29,paVar12,(size_t)aVar21);
      if (iVar10 != 0) goto LAB_00114a15;
      aVar21 = unaff_R12[2];
      paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)unaff_R12[8].seqtree;
      pcVar29 = (code *)ptr_handle[8].seqtree;
      paVar18[-0xc3].seqtree = (btree *)0x11496e;
      iVar10 = bcmp(paVar12,pcVar29,(size_t)aVar21);
      if (iVar10 != 0) goto LAB_00114a20;
      paVar18[-0xc3].seqtree = (btree *)0x11497e;
      fdb_doc_free((fdb_doc *)unaff_R12);
      paVar18[-0xc0].seqtree = (btree *)0x0;
      paVar12 = paVar18 + -0xbd;
      cVar19 = aVar26._0_1_;
      aVar26.seqtree = (btree *)0x0;
      if (cVar19 == '\0') {
        paVar18[-0xc3].seqtree = (btree *)0x1149a5;
        fdb_kvs_close((fdb_kvs_handle *)paVar18[-0xbf].seqtree);
        paVar18[-0xc3].seqtree = (btree *)0x1149af;
        fdb_close((fdb_file_handle *)paVar18[-0xbb].seqtree);
        paVar18[-0xc3].seqtree = (btree *)0x1149b9;
        fdb_doc_free((fdb_doc *)paVar18[-0xbe].seqtree);
        paVar18[-0xc3].seqtree = (btree *)0x1149c3;
        fdb_doc_free((fdb_doc *)paVar18[-0xbd].seqtree);
        paVar18[-0xc3].seqtree = (btree *)0x1149c8;
        fdb_shutdown();
        paVar18[-0xc3].seqtree = (btree *)0x1149cd;
        memleak_end();
        pcVar28 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar28 = "%s FAILED\n";
        }
        paVar18[-0xc3].seqtree = (btree *)0x1149fe;
        iVar10 = fprintf(_stderr,pcVar28,"incomplete block test");
        return (void *)CONCAT44(extraout_var,iVar10);
      }
    }
    paVar18[-0xc3].seqtree = (btree *)0x114a15;
    incomplete_block_test();
LAB_00114a15:
    paVar18[-0xc3].seqtree = (btree *)0x114a20;
    incomplete_block_test();
LAB_00114a20:
    paVar18[-0xc3].seqtree = (btree *)0x114a2b;
    incomplete_block_test();
  }
  paVar18[-0xc3].seqtree = (btree *)custom_compare_primitive_test;
  incomplete_block_test();
  paVar18[-0xc3] = aVar26;
  paVar18[-0xc4].seqtree = (btree *)paVar31;
  paVar18[-0xc5].seqtree = (btree *)paVar12;
  paVar18[-0xc6] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar29;
  paVar18[-199] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)unaff_R12;
  paVar18[-200].seqtree = (btree *)ptr_handle;
  uVar16 = 0;
  paVar18[-0x140].seqtree = (btree *)0x114a4f;
  gettimeofday((timeval *)(paVar18 + -0x138),(__timezone_ptr_t)0x0);
  paVar18[-0x140].seqtree = (btree *)0x114a54;
  memleak_start();
  paVar18[-0x13c].seqtree = (btree *)0x0;
  paVar18[-0x140].seqtree = (btree *)0x114a65;
  system("rm -rf  dummy* > errorlog.txt");
  paVar18[-0x140].seqtree = (btree *)0x114a75;
  fdb_get_default_config();
  paVar18[-0x140].seqtree = (btree *)0x114a82;
  fdb_get_default_kvs_config();
  paVar18[-0x107].seqtree = (btree *)0x0;
  paVar18[-0x106] = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x400;
  puVar8 = (uint8_t *)((long)paVar18 + -0x81c);
  puVar8[0] = '\x01';
  puVar8[1] = '\0';
  puVar8[2] = '\0';
  puVar8[3] = '\0';
  *(uint8_t *)((long)paVar18 + -0x811) = '\0';
  *(undefined1 *)(paVar18 + -0x100) = 1;
  paVar18[-0x135].seqtree = (btree *)_cmp_double;
  paVar18[-0x140].seqtree = (btree *)0x114ac2;
  fdb_open((fdb_file_handle **)&paVar18[-0x139].seqtree,"./dummy1",(fdb_config *)(paVar18 + -0x108))
  ;
  paVar18[-0x140].seqtree = (btree *)0x114ad6;
  fdb_kvs_open_default
            ((fdb_file_handle *)paVar18[-0x139].seqtree,(fdb_kvs_handle **)&paVar18[-0x13a].seqtree,
             (fdb_kvs_config *)(paVar18 + -0x136));
  paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)paVar18[-0x13a].seqtree;
  pcVar29 = logCallbackFunc;
  paVar18[-0x140].seqtree = (btree *)0x114aec;
  fVar9 = fdb_set_log_callback
                    ((fdb_kvs_handle *)paVar12,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar9 == FDB_RESULT_SUCCESS) {
    paVar12 = paVar18 + -0x133;
    paVar31 = paVar18 + -0xe9;
    lVar27 = 0;
    do {
      aVar26 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(10000.0 / (double)(int)lVar27);
      paVar18[-0x129] = aVar26;
      paVar18[-0x13e] = aVar26;
      paVar18[-0x140].seqtree = (btree *)0x114b47;
      sprintf((char *)paVar31,"value: %d, %f",aVar26._0_4_,uVar16);
      paVar18[-0x140].seqtree = (btree *)0x114b4f;
      sVar11 = strlen((char *)paVar31);
      paVar18[-0x13f].seqtree = (btree *)(sVar11 + 1);
      paVar18[-0x140].seqtree = (btree *)0x114b6e;
      fdb_doc_create((fdb_doc **)&paVar12->seqtree,paVar18 + -0x129,8,(void *)0x0,0,paVar31,
                     (size_t)paVar18[-0x13f]);
      pfVar5 = (fdb_doc *)paVar12->seqtree;
      paVar18[-0x140].seqtree = (btree *)0x114b7b;
      fdb_set((fdb_kvs_handle *)paVar18[-0x13a].seqtree,pfVar5);
      lVar27 = lVar27 + 0xb;
      uVar16 = (ulong)((int)uVar16 + 1);
      paVar12 = paVar12 + 1;
    } while (lVar27 != 0x6e);
    paVar31 = paVar18 + -0x13b;
    *paVar31 = paVar18[-0x13e];
    *(undefined4 *)(paVar18 + -0x13f) = 0;
    in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    paVar18[-0x140].seqtree = (btree *)0x114bba;
    fdb_iterator_init((fdb_kvs_handle *)paVar18[-0x13a].seqtree,
                      (fdb_iterator **)&paVar18[-0x13d].seqtree,(void *)0x0,0,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)(paVar18 + -0x13f));
    uVar32 = 0;
    uVar33 = 0xbff00000;
    do {
      aVar21._4_4_ = uVar33;
      aVar21._0_4_ = uVar32;
      paVar18[-0x13e] = aVar21;
      paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)paVar18[-0x13d].seqtree;
      paVar18[-0x140].seqtree = (btree *)0x114bda;
      pcVar29 = (code *)(paVar18 + -0x13c);
      fVar9 = fdb_iterator_get((fdb_iterator *)paVar12,(fdb_doc **)&paVar18[-0x13c].seqtree);
      if (fVar9 != FDB_RESULT_SUCCESS) {
LAB_00114e2d:
        paVar18[-0x140].seqtree = (btree *)0x114e32;
        custom_compare_primitive_test();
        goto LAB_00114e32;
      }
      phVar6 = paVar18[-0x13c].seqtrie;
      sVar11 = *(size_t *)&phVar6->chunksize;
      pcVar29 = (code *)phVar6->aux;
      paVar18[-0x140].seqtree = (btree *)0x114bf6;
      paVar12 = paVar31;
      memcpy(paVar31,pcVar29,sVar11);
      aVar26 = paVar18[-0x13b];
      if ((double)aVar26 < (double)paVar18[-0x13e] || (double)aVar26 == (double)paVar18[-0x13e]) {
        paVar18[-0x140].seqtree = (btree *)0x114e2d;
        custom_compare_primitive_test();
        goto LAB_00114e2d;
      }
      paVar18[-0x13e] = aVar26;
      paVar18[-0x140].seqtree = (btree *)0x114c16;
      fdb_doc_free((fdb_doc *)phVar6);
      paVar18[-0x13c].seqtree = (btree *)0x0;
      paVar18[-0x140].seqtree = (btree *)0x114c29;
      fVar9 = fdb_iterator_next((fdb_iterator *)paVar18[-0x13d].seqtree);
      uVar32 = SUB84(paVar18[-0x13e],0);
      uVar33 = SUB84(paVar18[-0x13e],4);
    } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
    paVar18[-0x140].seqtree = (btree *)0x114c41;
    fdb_iterator_close((fdb_iterator *)paVar18[-0x13d].seqtree);
    paVar18[-0x140].seqtree = (btree *)0x114c50;
    fdb_commit((fdb_file_handle *)paVar18[-0x139].seqtree,'\x01');
    *(undefined4 *)(paVar18 + -0x13f) = 0;
    in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    paVar18[-0x140].seqtree = (btree *)0x114c6e;
    fdb_iterator_init((fdb_kvs_handle *)paVar18[-0x13a].seqtree,
                      (fdb_iterator **)&paVar18[-0x13d].seqtree,(void *)0x0,0,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)(paVar18 + -0x13f));
    uVar32 = 0;
    uVar33 = 0xbff00000;
    do {
      aVar22._4_4_ = uVar33;
      aVar22._0_4_ = uVar32;
      paVar18[-0x13e] = aVar22;
      paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)paVar18[-0x13d].seqtree;
      paVar18[-0x140].seqtree = (btree *)0x114c93;
      pcVar29 = (code *)(paVar18 + -0x13c);
      fVar9 = fdb_iterator_get((fdb_iterator *)paVar12,(fdb_doc **)&paVar18[-0x13c].seqtree);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00114e37;
      phVar6 = paVar18[-0x13c].seqtrie;
      sVar11 = *(size_t *)&phVar6->chunksize;
      pcVar29 = (code *)phVar6->aux;
      paVar18[-0x140].seqtree = (btree *)0x114caf;
      paVar12 = paVar18 + -0x13b;
      memcpy(paVar18 + -0x13b,pcVar29,sVar11);
      aVar26 = paVar18[-0x13b];
      if ((double)aVar26 < (double)paVar18[-0x13e] || (double)aVar26 == (double)paVar18[-0x13e])
      goto LAB_00114e32;
      paVar18[-0x13e] = aVar26;
      paVar18[-0x140].seqtree = (btree *)0x114ccf;
      fdb_doc_free((fdb_doc *)phVar6);
      paVar18[-0x13c].seqtree = (btree *)0x0;
      paVar18[-0x140].seqtree = (btree *)0x114ce2;
      fVar9 = fdb_iterator_next((fdb_iterator *)paVar18[-0x13d].seqtree);
      uVar32 = SUB84(paVar18[-0x13e],0);
      uVar33 = SUB84(paVar18[-0x13e],4);
    } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
    paVar18[-0x140].seqtree = (btree *)0x114cfa;
    fdb_iterator_close((fdb_iterator *)paVar18[-0x13d].seqtree);
    paVar18[-0x140].seqtree = (btree *)0x114d0b;
    fdb_compact((fdb_file_handle *)paVar18[-0x139].seqtree,"./dummy2");
    *(undefined4 *)(paVar18 + -0x13f) = 0;
    in_RCX = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
    paVar18[-0x140].seqtree = (btree *)0x114d29;
    fdb_iterator_init((fdb_kvs_handle *)paVar18[-0x13a].seqtree,
                      (fdb_iterator **)&paVar18[-0x13d].seqtree,(void *)0x0,0,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)(paVar18 + -0x13f));
    uVar32 = 0;
    uVar33 = 0xbff00000;
    while( true ) {
      aVar23._4_4_ = uVar33;
      aVar23._0_4_ = uVar32;
      paVar18[-0x13e] = aVar23;
      paVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)paVar18[-0x13d].seqtree;
      paVar18[-0x140].seqtree = (btree *)0x114d4e;
      pcVar29 = (code *)(paVar18 + -0x13c);
      fVar9 = fdb_iterator_get((fdb_iterator *)paVar12,(fdb_doc **)&paVar18[-0x13c].seqtree);
      if (fVar9 != FDB_RESULT_SUCCESS) break;
      phVar6 = paVar18[-0x13c].seqtrie;
      sVar11 = *(size_t *)&phVar6->chunksize;
      pcVar29 = (code *)phVar6->aux;
      paVar18[-0x140].seqtree = (btree *)0x114d6a;
      paVar12 = paVar18 + -0x13b;
      memcpy(paVar18 + -0x13b,pcVar29,sVar11);
      aVar26 = paVar18[-0x13b];
      if ((double)aVar26 < (double)paVar18[-0x13e] || (double)aVar26 == (double)paVar18[-0x13e])
      goto LAB_00114e3c;
      paVar18[-0x13e] = aVar26;
      paVar18[-0x140].seqtree = (btree *)0x114d8a;
      fdb_doc_free((fdb_doc *)phVar6);
      paVar18[-0x13c].seqtree = (btree *)0x0;
      paVar18[-0x140].seqtree = (btree *)0x114d9d;
      fVar9 = fdb_iterator_next((fdb_iterator *)paVar18[-0x13d].seqtree);
      uVar32 = SUB84(paVar18[-0x13e],0);
      uVar33 = SUB84(paVar18[-0x13e],4);
      if (fVar9 == FDB_RESULT_ITERATOR_FAIL) {
        paVar18[-0x140].seqtree = (btree *)0x114db2;
        fdb_iterator_close((fdb_iterator *)paVar18[-0x13d].seqtree);
        paVar18[-0x140].seqtree = (btree *)0x114dbc;
        fdb_kvs_close((fdb_kvs_handle *)paVar18[-0x13a].seqtree);
        paVar18[-0x140].seqtree = (btree *)0x114dc6;
        fdb_close((fdb_file_handle *)paVar18[-0x139].seqtree);
        lVar27 = 0;
        do {
          pfVar5 = (fdb_doc *)paVar18[lVar27 + -0x133].seqtree;
          paVar18[-0x140].seqtree = (btree *)0x114dd2;
          fdb_doc_free(pfVar5);
          lVar27 = lVar27 + 1;
        } while (lVar27 != 10);
        paVar18[-0x140].seqtree = (btree *)0x114de0;
        fdb_shutdown();
        paVar18[-0x140].seqtree = (btree *)0x114de5;
        memleak_end();
        pcVar28 = "%s PASSED\n";
        if (custom_compare_primitive_test()::__test_pass != '\0') {
          pcVar28 = "%s FAILED\n";
        }
        paVar18[-0x140].seqtree = (btree *)0x114e16;
        iVar10 = fprintf(_stderr,pcVar28,"custom compare function for primitive key test");
        return (void *)CONCAT44(extraout_var_00,iVar10);
      }
    }
LAB_00114e41:
    paVar18[-0x140].seqtree = (btree *)0x114e46;
    custom_compare_primitive_test();
  }
  paVar18[-0x140].seqtree = (btree *)_cmp_double;
  custom_compare_primitive_test();
  pvVar15 = (void *)0xffffffff;
  if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar29 !=
      (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
    if (in_RCX == (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
      return (void *)0x1;
    }
    if (*extraout_RDX <= (double)*paVar12) {
      pvVar15 = (void *)(ulong)(*extraout_RDX < (double)*paVar12);
    }
  }
  return pvVar15;
}

Assistant:

void *multi_thread_client_shutdown(void *args)
{

    TEST_INIT();

    int i, r;
    int nclients;
    fdb_file_handle *tdbfile;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;
        nclients = 2;
        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            thread_create(&tid[i], multi_thread_client_shutdown, (void *)&i);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // threads enter here //

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    // open/close db
    status = fdb_open(&tdbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(fdb_close(tdbfile) == FDB_RESULT_SUCCESS);

    // shutdown
    fdb_shutdown();
    thread_exit(0);
    return NULL;
}